

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O0

double __thiscall FNodeBuilder::InterceptVector(FNodeBuilder *this,node_t *splitter,FPrivSeg *seg)

{
  int iVar1;
  FPrivVert *pFVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double frac;
  double num;
  double v1y;
  double v1x;
  double den;
  double v1dy;
  double v1dx;
  double v2dy;
  double v2dx;
  double v2y;
  double v2x;
  FPrivSeg *seg_local;
  node_t *splitter_local;
  FNodeBuilder *this_local;
  
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)seg->v1);
  dVar3 = (double)(pFVar2->super_FSimpleVert).x;
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)seg->v1);
  dVar4 = (double)(pFVar2->super_FSimpleVert).y;
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)seg->v2);
  iVar1 = (pFVar2->super_FSimpleVert).x;
  pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                     (&this->Vertices,(long)seg->v2);
  dVar5 = (double)splitter->dy * ((double)iVar1 - dVar3) -
          (double)splitter->dx * ((double)(pFVar2->super_FSimpleVert).y - dVar4);
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    this_local = (FNodeBuilder *)
                 ((((double)splitter->x - dVar3) * (double)splitter->dy +
                  (dVar4 - (double)splitter->y) * (double)splitter->dx) / dVar5);
  }
  else {
    this_local = (FNodeBuilder *)0x0;
  }
  return (double)this_local;
}

Assistant:

double FNodeBuilder::InterceptVector (const node_t &splitter, const FPrivSeg &seg)
{
	double v2x = (double)Vertices[seg.v1].x;
	double v2y = (double)Vertices[seg.v1].y;
	double v2dx = (double)Vertices[seg.v2].x - v2x;
	double v2dy = (double)Vertices[seg.v2].y - v2y;
	double v1dx = (double)splitter.dx;
	double v1dy = (double)splitter.dy;

	double den = v1dy*v2dx - v1dx*v2dy;

	if (den == 0.0)
		return 0;		// parallel

	double v1x = (double)splitter.x;
	double v1y = (double)splitter.y;

	double num = (v1x - v2x)*v1dy + (v2y - v1y)*v1dx;
	double frac = num / den;

	return frac;
}